

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_ircode.c
# Opt level: O0

void ircode_patch_init(ircode_t *code,uint16_t index)

{
  size_t sVar1;
  code_r *pcVar2;
  uint32_t uVar3;
  uint32_t p1;
  inst_t *piVar4;
  inst_t *piVar5;
  inst_t *piVar6;
  inst_t *piVar7;
  code_r *pcVar8;
  inst_t **ppiVar9;
  size_t local_88;
  size_t local_80;
  size_t local_78;
  size_t local_70;
  size_t local_68;
  inst_t *inst;
  uint32_t i;
  uint32_t count;
  code_r *orig_list;
  code_r *list;
  inst_t *inst4;
  inst_t *inst3;
  uint32_t dest2;
  inst_t *inst2;
  inst_t *inst1;
  uint32_t dest;
  uint16_t index_local;
  ircode_t *code_local;
  
  uVar3 = ircode_register_push_temp(code);
  piVar4 = inst_new(LOADK,uVar3,(uint)index,0,NO_TAG,0,0.0,0);
  piVar5 = inst_new(LOAD,uVar3,0,uVar3,NO_TAG,0,0.0,0);
  p1 = ircode_register_push_temp(code);
  piVar6 = inst_new(MOVE,p1,0,0,NO_TAG,0,0.0,0);
  ircode_register_pop(code);
  piVar7 = inst_new(CALL,uVar3,uVar3,1,NO_TAG,0,0.0,0);
  ircode_register_pop(code);
  pcVar8 = (code_r *)gravity_calloc((gravity_vm *)0x0,1,0x18);
  pcVar8->m = 0;
  pcVar8->n = 0;
  pcVar8->p = (inst_t **)0x0;
  if (pcVar8->n == pcVar8->m) {
    if (pcVar8->m == 0) {
      local_68 = 8;
    }
    else {
      local_68 = pcVar8->m << 1;
    }
    pcVar8->m = local_68;
    ppiVar9 = (inst_t **)realloc(pcVar8->p,pcVar8->m << 3);
    pcVar8->p = ppiVar9;
  }
  sVar1 = pcVar8->n;
  pcVar8->n = sVar1 + 1;
  pcVar8->p[sVar1] = piVar4;
  if (pcVar8->n == pcVar8->m) {
    if (pcVar8->m == 0) {
      local_70 = 8;
    }
    else {
      local_70 = pcVar8->m << 1;
    }
    pcVar8->m = local_70;
    ppiVar9 = (inst_t **)realloc(pcVar8->p,pcVar8->m << 3);
    pcVar8->p = ppiVar9;
  }
  sVar1 = pcVar8->n;
  pcVar8->n = sVar1 + 1;
  pcVar8->p[sVar1] = piVar5;
  if (pcVar8->n == pcVar8->m) {
    if (pcVar8->m == 0) {
      local_78 = 8;
    }
    else {
      local_78 = pcVar8->m << 1;
    }
    pcVar8->m = local_78;
    ppiVar9 = (inst_t **)realloc(pcVar8->p,pcVar8->m << 3);
    pcVar8->p = ppiVar9;
  }
  sVar1 = pcVar8->n;
  pcVar8->n = sVar1 + 1;
  pcVar8->p[sVar1] = piVar6;
  if (pcVar8->n == pcVar8->m) {
    if (pcVar8->m == 0) {
      local_80 = 8;
    }
    else {
      local_80 = pcVar8->m << 1;
    }
    pcVar8->m = local_80;
    ppiVar9 = (inst_t **)realloc(pcVar8->p,pcVar8->m << 3);
    pcVar8->p = ppiVar9;
  }
  sVar1 = pcVar8->n;
  pcVar8->n = sVar1 + 1;
  pcVar8->p[sVar1] = piVar7;
  pcVar2 = code->list;
  uVar3 = ircode_count(code);
  for (inst._0_4_ = 0; (uint)inst < uVar3; inst._0_4_ = (uint)inst + 1) {
    piVar4 = pcVar2->p[(uint)inst];
    if (pcVar8->n == pcVar8->m) {
      if (pcVar8->m == 0) {
        local_88 = 8;
      }
      else {
        local_88 = pcVar8->m << 1;
      }
      pcVar8->m = local_88;
      ppiVar9 = (inst_t **)realloc(pcVar8->p,pcVar8->m << 3);
      pcVar8->p = ppiVar9;
    }
    sVar1 = pcVar8->n;
    pcVar8->n = sVar1 + 1;
    pcVar8->p[sVar1] = piVar4;
  }
  if (pcVar2->p != (inst_t **)0x0) {
    free(pcVar2->p);
  }
  free(code->list);
  code->list = pcVar8;
  return;
}

Assistant:

void ircode_patch_init (ircode_t *code, uint16_t index) {
    // prepend call instructions to code
    // LOADK temp index
    // LOAD  temp 0 temp
    // MOVE  temp+1 0
    // CALL  temp temp 1

    // load constant
    uint32_t dest = ircode_register_push_temp(code);
	inst_t *inst1 = inst_new(LOADK, dest, index, 0, NO_TAG, 0, 0.0, 0);

    // load from lookup
	inst_t *inst2 = inst_new(LOAD, dest, 0, dest, NO_TAG, 0, 0.0, 0);

    // prepare parameter
    uint32_t dest2 = ircode_register_push_temp(code);
	inst_t *inst3 = inst_new(MOVE, dest2, 0, 0, NO_TAG, 0, 0.0, 0);
    ircode_register_pop(code);

    // execute call
	inst_t *inst4 = inst_new(CALL, dest, dest, 1, NO_TAG, 0, 0.0, 0);

    // pop temps used
    ircode_register_pop(code);

    // create new instruction list
    code_r        *list = mem_alloc(NULL, sizeof(code_r));
    marray_init(*list);

    // add newly create instructions
    marray_push(inst_t*, *list, inst1);
    marray_push(inst_t*, *list, inst2);
    marray_push(inst_t*, *list, inst3);
    marray_push(inst_t*, *list, inst4);

    // then copy original instructions
    code_r *orig_list = code->list;
    uint32_t count = ircode_count(code);
    for (uint32_t i=0; i<count; ++i) {
        inst_t *inst = marray_get(*orig_list, i);
        marray_push(inst_t*, *list, inst);
    }

    // free dest list
    marray_destroy(*orig_list);
    mem_free(code->list);

    // replace dest list with the newly created list
    code->list = list;
}